

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O2

void * metacall_value_cast_null(void **v)

{
  type_id tVar1;
  value v_00;
  void *pvVar2;
  
  tVar1 = value_type_id(*v);
  v_00 = *v;
  if (tVar1 != 0xe) {
    v_00 = value_type_cast(v_00,0xe);
    if (v_00 == (value)0x0) {
      v_00 = *v;
    }
    else {
      *v = v_00;
    }
  }
  pvVar2 = value_to_null(v_00);
  return pvVar2;
}

Assistant:

void *metacall_value_cast_null(void **v)
{
	if (value_type_id(*v) != TYPE_NULL)
	{
		value v_cast = value_type_cast(*v, TYPE_NULL);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_null(*v);
}